

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing
          (SoundAnalysisPreprocessing *this,SoundAnalysisPreprocessing *from)

{
  void *pvVar1;
  SoundAnalysisPreprocessing_Vggish *this_00;
  SoundAnalysisPreprocessing_Vggish *from_00;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__SoundAnalysisPreprocessing_0034aef0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x14) {
    this_00 = mutable_vggish(this);
    from_00 = vggish(from);
    SoundAnalysisPreprocessing_Vggish::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(const SoundAnalysisPreprocessing& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_SoundAnalysisPreprocessingType();
  switch (from.SoundAnalysisPreprocessingType_case()) {
    case kVggish: {
      mutable_vggish()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish::MergeFrom(from.vggish());
      break;
    }
    case SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
}